

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeVmEval.cpp
# Opt level: O2

uint GetStorageIndex(InstructionVMEvalContext *ctx,Storage *storage)

{
  uint uVar1;
  Storage *local_18;
  
  uVar1 = storage->index;
  if (uVar1 == 0) {
    local_18 = storage;
    SmallArray<InstructionVMEvalContext::Storage_*,_32U>::push_back(&ctx->storageSet,&local_18);
    uVar1 = (ctx->storageSet).count;
    local_18->index = uVar1;
  }
  return uVar1;
}

Assistant:

unsigned GetStorageIndex(InstructionVMEvalContext &ctx, InstructionVMEvalContext::Storage *storage)
{
	if(storage->index != 0)
		return storage->index;

	ctx.storageSet.push_back(storage);
	storage->index = ctx.storageSet.size();

	return storage->index;
}